

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O3

void LabelMission(int id)

{
  uint uVar1;
  ulong uVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  FILE *__stream_00;
  uint uVar8;
  char *pcVar9;
  char line [1024];
  char local_438 [1032];
  
  uVar2 = (ulong)(uint)id;
  pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
  __stream = missionfile;
  if (missionfile == (FILE *)0x0 && bMissionRunning == 0) {
    pcVar9 = "Cannot use label outside a mission file.";
  }
  else {
    if ((uint)id < 0x400) {
      uVar1 = labels[uVar2];
      if ((int)uVar1 < 1) {
        lVar5 = ftell((FILE *)missionfile);
        rewind((FILE *)__stream);
        lVar5 = (long)(int)lVar5;
        iVar3 = 0;
        do {
          do {
            pcVar9 = fgets(local_438,0x400,(FILE *)__stream);
            if (pcVar9 == (char *)0x0) {
              fseek((FILE *)__stream,lVar5,0);
              goto LAB_0013a3f2;
            }
            sVar6 = strlen(pcVar9);
          } while ((sVar6 == 0x3ff) && (pcVar9[0x3fe] != '\n'));
          iVar3 = iVar3 + 1;
          lVar7 = ftell((FILE *)__stream);
        } while (lVar7 <= lVar5);
        iVar4 = fseek((FILE *)__stream,lVar5,0);
        if (iVar4 == 0) {
          labels[uVar2] = iVar3;
        }
        else {
LAB_0013a3f2:
          labels[uVar2] = -1;
          puts("File error.");
        }
      }
      else {
        lVar5 = ftell((FILE *)missionfile);
        rewind((FILE *)__stream);
        lVar5 = (long)(int)lVar5;
        uVar8 = 0;
        do {
          do {
            pcVar9 = fgets(local_438,0x400,(FILE *)__stream);
            if (pcVar9 == (char *)0x0) {
              fseek((FILE *)__stream,lVar5,0);
              uVar8 = 0xffffffff;
              goto LAB_0013a340;
            }
            sVar6 = strlen(pcVar9);
          } while ((sVar6 == 0x3ff) && (pcVar9[0x3fe] != '\n'));
          uVar8 = uVar8 + 1;
          lVar7 = ftell((FILE *)__stream);
        } while (lVar7 <= lVar5);
        iVar3 = fseek((FILE *)__stream,lVar5,0);
        uVar8 = -(uint)(iVar3 != 0) | uVar8;
LAB_0013a340:
        if (uVar1 != uVar8) {
          printf("Label %d already exists.\n",uVar2);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
      __stream_00 = fopen("log/CurLbl.txt","w");
      if (__stream_00 == (FILE *)0x0) {
        pcVar9 = "Unable to create current label file.";
      }
      else {
        iVar3 = fprintf(__stream_00,"%d",uVar2);
        if (iVar3 < 1) {
          puts("Error writing current label file.");
          fclose(__stream_00);
          return;
        }
        iVar3 = fclose(__stream_00);
        if (iVar3 == 0) {
          return;
        }
        pcVar9 = "Error closing current label file.";
      }
      puts(pcVar9);
      return;
    }
    pcVar9 = "Invalid parameter.";
  }
  puts(pcVar9);
  pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  return;
}

Assistant:

inline void LabelMission(int id)
{
	EnterCriticalSection(&MissionFilesCS);
	if ((!bMissionRunning)&&(!missionfile))
	{
		printf("Cannot use label outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((id < 0)||(id >= MAX_NB_LABELS))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	// Labels are reset every time a new mission file is opened.
	if (labels[id] > 0) 
	{
		if (labels[id] != ftellline(missionfile))
		{
			printf("Label %d already exists.\n", id);
		}
	}
	else 
	{
		labels[id] = ftellline(missionfile);
		if (labels[id] <= 0)
		{
			printf("File error.\n");
		}
	}
	LeaveCriticalSection(&MissionFilesCS);
	SetCurrentLabelEx(LOG_FOLDER"CurLbl.txt", id);
}